

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Define.h
# Opt level: O3

Unique<anurbs::Entry<anurbs::Polyline<2L>_>_> __thiscall
anurbs::
new_<anurbs::Entry<anurbs::Polyline<2l>>,std::shared_ptr<anurbs::Polyline<2l>>&,std::shared_ptr<anurbs::Attributes>&>
          (anurbs *this,shared_ptr<anurbs::Polyline<2L>_> *args,
          shared_ptr<anurbs::Attributes> *args_1)

{
  Entry<anurbs::Polyline<2L>_> *this_00;
  shared_ptr<anurbs::Polyline<2L>_> local_40;
  shared_ptr<anurbs::Attributes> local_30;
  
  this_00 = (Entry<anurbs::Polyline<2L>_> *)operator_new(0x48);
  local_40.super___shared_ptr<anurbs::Polyline<2L>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (args->super___shared_ptr<anurbs::Polyline<2L>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_40.super___shared_ptr<anurbs::Polyline<2L>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (args->super___shared_ptr<anurbs::Polyline<2L>,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi;
  if (local_40.super___shared_ptr<anurbs::Polyline<2L>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_40.super___shared_ptr<anurbs::Polyline<2L>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_40.super___shared_ptr<anurbs::Polyline<2L>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_40.super___shared_ptr<anurbs::Polyline<2L>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_40.super___shared_ptr<anurbs::Polyline<2L>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_30.super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (args_1->super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_30.super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (args_1->super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi;
  if (local_30.super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_30.super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (local_30.super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_30.super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (local_30.super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  Entry<anurbs::Polyline<2L>_>::Entry(this_00,&local_40,&local_30);
  *(Entry<anurbs::Polyline<2L>_> **)this = this_00;
  if (local_30.super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_40.super___shared_ptr<anurbs::Polyline<2L>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<anurbs::Polyline<2L>,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return (__uniq_ptr_data<anurbs::Entry<anurbs::Polyline<2L>_>,_std::default_delete<anurbs::Entry<anurbs::Polyline<2L>_>_>,_true,_true>
          )(__uniq_ptr_data<anurbs::Entry<anurbs::Polyline<2L>_>,_std::default_delete<anurbs::Entry<anurbs::Polyline<2L>_>_>,_true,_true>
            )this;
}

Assistant:

Unique<T> new_(TArgs&&... args)
{
    return Unique<T>(new T(std::forward<TArgs>(args)...));
}